

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

void __thiscall f8n::prefs::Preferences::SetBool(Preferences *this,char *key,bool value)

{
  undefined7 in_register_00000011;
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,key,&local_39);
  (*(this->super_IPreferences)._vptr_IPreferences[0xe])
            (this,local_38,CONCAT71(in_register_00000011,value) & 0xffffffff);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Preferences::SetBool(const char* key, bool value) {
    this->SetBool(std::string(key), value);
}